

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AtomEscapePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  StandardChars<unsigned_char> *pSVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  CharCount n;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  ScriptConfiguration *this_00;
  codepoint_t value;
  int lengthOfSurrogate;
  bool surrogateEncountered;
  Char c;
  EncodedChar *current;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPStack_18;
  EncodedChar ec;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  pPStack_18 = this;
  current._7_1_ = ECLookahead(this,0);
  if ((current._7_1_ == '\0') && (bVar3 = IsEOF(this), bVar3)) {
    Fail(this,-0x7ff5ec67);
    this_local._7_1_ = false;
  }
  else {
    bVar3 = StandardChars<unsigned_char>::IsDigit(this->standardEncodedChars,current._7_1_);
    if (bVar3) {
      do {
        ECConsume(this,1);
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,0);
        bVar3 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
      } while (bVar3);
      this_local._7_1_ = false;
    }
    else {
      EVar4 = ECLookahead(this,0);
      if (EVar4 == 'c') {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,1);
        bVar3 = StandardChars<unsigned_char>::IsLetter(pSVar1,EVar4);
        if (bVar3) {
          ECConsume(this,2);
        }
        else {
          DeferredFailIfUnicode(this,-0x7ff5e9d6);
        }
        this_local._7_1_ = false;
      }
      else {
        _lengthOfSurrogate = this->next;
        value._2_2_ = NextChar(this);
        if ((value._2_2_ == L'B') || (value._2_2_ == L'b')) {
          this_local._7_1_ = true;
        }
        else {
          if (value._2_2_ == L'u') {
            value._1_1_ = 0;
            n = TryParseExtendedUnicodeEscape
                          (this,(Char *)((long)&value + 2),(bool *)((long)&value + 1),true);
            if ((int)n < 1) {
              bVar3 = ECCanConsume(this,4);
              if (bVar3) {
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,0);
                bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
                if (bVar3) {
                  pSVar1 = this->standardEncodedChars;
                  EVar4 = ECLookahead(this,1);
                  bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
                  if (bVar3) {
                    pSVar1 = this->standardEncodedChars;
                    EVar4 = ECLookahead(this,2);
                    bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
                    if (bVar3) {
                      pSVar1 = this->standardEncodedChars;
                      EVar4 = ECLookahead(this,3);
                      bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
                      if (bVar3) {
                        this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
                        bVar3 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
                        if (bVar3) {
                          pSVar1 = this->standardEncodedChars;
                          EVar4 = ECLookahead(this,0);
                          uVar5 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                          pSVar1 = this->standardEncodedChars;
                          EVar4 = ECLookahead(this,1);
                          uVar6 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                          pSVar1 = this->standardEncodedChars;
                          EVar4 = ECLookahead(this,2);
                          uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                          pSVar1 = this->standardEncodedChars;
                          EVar4 = ECLookahead(this,3);
                          uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                          TrackIfSurrogatePair
                                    (this,uVar5 << 0xc | uVar6 << 8 | uVar7 << 4 | uVar8,
                                     this->next + -1,5);
                        }
                        ECConsume(this,4);
                      }
                    }
                  }
                }
              }
            }
            else if ((value._1_1_ & 1) != 0) {
              if ((this->ctAllocator != (ArenaAllocator *)0x0) &&
                 (this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x620,
                                   "(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr)"
                                   ,
                                   "this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr"
                                  );
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
              if ((this->ctAllocator != (ArenaAllocator *)0x0) &&
                 (_lengthOfSurrogate != this->currentSurrogatePairNode->location)) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x621,
                                   "(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location)"
                                   ,
                                   "this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location"
                                  );
                if (!bVar3) {
                  pcVar2 = (code *)invalidInstructionException();
                  (*pcVar2)();
                }
                puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar9 = 0;
              }
              ECConsume(this,n);
            }
          }
          else if ((value._2_2_ == L'x') && (bVar3 = ECCanConsume(this,2), bVar3)) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,0);
            bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,1);
              bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
              if (bVar3) {
                ECConsume(this,2);
              }
            }
          }
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::AtomEscapePass0()
    {
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            // Terminating 0
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsDigit(ec))
        {
            do
            {
                ECConsume();
            }
            while (standardEncodedChars->IsDigit(ECLookahead())); // terminating 0 is not a digit
            return false;
        }
        else if (ECLookahead() == 'c')
        {
            if (standardEncodedChars->IsLetter(ECLookahead(1))) // terminating 0 is not a letter
            {
                ECConsume(2);
            }
            else
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
            }
            return false;
        }
        else
        {
            const EncodedChar *current = next;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
            case 'B':
                return true;
            // case 'c': handled as special case above
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                    ECConsume(2);
                break;
            case 'u':
                bool surrogateEncountered = false;
                int lengthOfSurrogate = TryParseExtendedUnicodeEscape(c, surrogateEncountered, true);
                if (lengthOfSurrogate > 0)
                {
                    if (surrogateEncountered)
                    {
                        // If we don't have an allocator, we don't create nodes
                        // Asserts in place as extra checks for when we do have an allocator
                        Assert(this->ctAllocator == nullptr || this->currentSurrogatePairNode != nullptr);
                        Assert(this->ctAllocator == nullptr || current == this->currentSurrogatePairNode->location);
                        ECConsume(lengthOfSurrogate);
                    }
                    //Don't fall through
                    break;
                }
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        codepoint_t value = (standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                                            (standardEncodedChars->DigitValue(ECLookahead(3)));
                        TrackIfSurrogatePair(value, (next - 1), 5);
                    }
                    ECConsume(4);
                }
                break;
            }
            // embedded 0 is ok

            return false;
        }
    }